

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

aiFace * __thiscall aiFace::operator=(aiFace *this,aiFace *o)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint *puVar3;
  aiFace *o_local;
  aiFace *this_local;
  
  if (o != this) {
    if (this->mIndices != (uint *)0x0) {
      operator_delete__(this->mIndices);
    }
    this->mNumIndices = o->mNumIndices;
    if (this->mNumIndices == 0) {
      this->mIndices = (uint *)0x0;
    }
    else {
      auVar1 = ZEXT416(this->mNumIndices) * ZEXT816(4);
      uVar2 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      puVar3 = (uint *)operator_new__(uVar2);
      this->mIndices = puVar3;
      memcpy(this->mIndices,o->mIndices,(ulong)this->mNumIndices << 2);
    }
  }
  return this;
}

Assistant:

aiFace& operator = ( const aiFace& o) {
        if (&o == this) {
            return *this;
        }

        delete[] mIndices;
        mNumIndices = o.mNumIndices;
        if (mNumIndices) {
            mIndices = new unsigned int[mNumIndices];
            ::memcpy( mIndices, o.mIndices, mNumIndices * sizeof( unsigned int));
        } else {
            mIndices = nullptr;
        }

        return *this;
    }